

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTruth.c
# Opt level: O3

void Map_TruthsCutOne(Map_Man_t *p,Map_Cut_t *pCut,uint *uTruth)

{
  char cVar1;
  uint uVar2;
  Map_Cut_t *pMVar3;
  Map_NodeVec_t *pMVar4;
  Map_Node_t **ppMVar5;
  Map_Node_t *pMVar6;
  Map_Node_t *pMVar7;
  ulong uVar8;
  float fVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  float fVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  
  cVar1 = pCut->nLeaves;
  if (0 < (long)cVar1) {
    lVar10 = 0;
    do {
      pMVar3 = pCut->ppLeaves[lVar10]->pCuts;
      pMVar3->fMark = '\x01';
      pMVar3->M[0].uPhaseBest = p->uTruths[lVar10][0];
      pMVar3->M[1].uPhaseBest = p->uTruths[lVar10][1];
      lVar10 = lVar10 + 1;
    } while (cVar1 != lVar10);
  }
  if (pCut->fMark == '\0') {
    pMVar4 = p->vVisited;
    pMVar4->nSize = 0;
    Map_CutsCollect_rec(pCut,pMVar4);
    pMVar4 = p->vVisited;
    uVar2 = pMVar4->nSize;
    if (0 < (int)uVar2) {
      pCut->nVolume = (char)uVar2;
      cVar1 = pCut->nLeaves;
      if (0 < (long)cVar1) {
        lVar10 = 0;
        do {
          pCut->ppLeaves[lVar10]->pCuts->fMark = '\0';
          lVar10 = lVar10 + 1;
        } while (cVar1 != lVar10);
      }
      ppMVar5 = pMVar4->pArray;
      uVar11 = 0;
      do {
        pMVar6 = ppMVar5[uVar11];
        *(undefined1 *)((long)&pMVar6->p2 + 6) = 0;
        pMVar7 = pMVar6->pNext;
        if (((ulong)pMVar7 & 1) == 0) {
          uVar12 = *(uint *)((long)&pMVar7->pRepr + 4);
          fVar13 = pMVar7->tRequired[1].Rise;
        }
        else {
          uVar12 = ~*(uint *)(((ulong)pMVar7 & 0xfffffffffffffffe) + 0x5c);
          fVar13 = (float)~*(uint *)(((ulong)pMVar7 & 0xfffffffffffffffe) + 0x84);
        }
        uVar8 = *(ulong *)&pMVar6->Num;
        if ((uVar8 & 1) == 0) {
          uVar14 = *(uint *)(uVar8 + 0x5c);
          uVar15 = *(uint *)(uVar8 + 0x84);
        }
        else {
          uVar14 = ~*(uint *)((uVar8 & 0xfffffffffffffffe) + 0x5c);
          uVar15 = ~*(uint *)((uVar8 & 0xfffffffffffffffe) + 0x84);
        }
        bVar16 = *(char *)((long)&pMVar6->p2 + 7) != '\0';
        fVar9 = (float)~(uVar15 & (uint)fVar13);
        if (!bVar16) {
          fVar9 = (float)(uVar15 & (uint)fVar13);
        }
        uVar12 = -(uint)bVar16 ^ uVar14 & uVar12;
        *(uint *)((long)&pMVar6->pRepr + 4) = uVar12;
        pMVar6->tRequired[1].Rise = fVar9;
        uVar11 = uVar11 + 1;
      } while (uVar2 != uVar11);
      *uTruth = uVar12;
      uTruth[1] = (uint)pMVar6->tRequired[1].Rise;
      return;
    }
    __assert_fail("p->vVisited->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                  ,0xd7,"void Map_TruthsCutOne(Map_Man_t *, Map_Cut_t *, unsigned int *)");
  }
  __assert_fail("pCut->fMark == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                ,0xd2,"void Map_TruthsCutOne(Map_Man_t *, Map_Cut_t *, unsigned int *)");
}

Assistant:

void Map_TruthsCutOne( Map_Man_t * p, Map_Cut_t * pCut, unsigned uTruth[] )
{
    unsigned uTruth1[2], uTruth2[2];
    Map_Cut_t * pTemp = NULL; // Suppress "might be used uninitialized"
    int i;
    // mark the cut leaves
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pTemp = pCut->ppLeaves[i]->pCuts;
        pTemp->fMark = 1;
        pTemp->M[0].uPhaseBest = p->uTruths[i][0];
        pTemp->M[1].uPhaseBest = p->uTruths[i][1];
    }
    assert( pCut->fMark == 0 );

    // collect the cuts in the cut cone
    p->vVisited->nSize = 0;
    Map_CutsCollect_rec( pCut, p->vVisited );
    assert( p->vVisited->nSize > 0 );
    pCut->nVolume = p->vVisited->nSize;

    // compute the tables and unmark
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pTemp = pCut->ppLeaves[i]->pCuts;
        pTemp->fMark = 0;
    }
    for ( i = 0; i < p->vVisited->nSize; i++ )
    {
        // get the cut
        pTemp = (Map_Cut_t *)p->vVisited->pArray[i];
        pTemp->fMark = 0;
        // get truth table of the first branch
        if ( Map_CutIsComplement(pTemp->pOne) )
        {
            uTruth1[0] = ~Map_CutRegular(pTemp->pOne)->M[0].uPhaseBest;
            uTruth1[1] = ~Map_CutRegular(pTemp->pOne)->M[1].uPhaseBest;
        }
        else
        {
            uTruth1[0] = Map_CutRegular(pTemp->pOne)->M[0].uPhaseBest;
            uTruth1[1] = Map_CutRegular(pTemp->pOne)->M[1].uPhaseBest;
        }
        // get truth table of the second branch
        if ( Map_CutIsComplement(pTemp->pTwo) )
        {
            uTruth2[0] = ~Map_CutRegular(pTemp->pTwo)->M[0].uPhaseBest;
            uTruth2[1] = ~Map_CutRegular(pTemp->pTwo)->M[1].uPhaseBest;
        }
        else
        {
            uTruth2[0] = Map_CutRegular(pTemp->pTwo)->M[0].uPhaseBest;
            uTruth2[1] = Map_CutRegular(pTemp->pTwo)->M[1].uPhaseBest;
        }
        // get the truth table of the output
        if ( !pTemp->Phase )
        {
            pTemp->M[0].uPhaseBest = uTruth1[0] & uTruth2[0];
            pTemp->M[1].uPhaseBest = uTruth1[1] & uTruth2[1];
        }
        else
        {
            pTemp->M[0].uPhaseBest = ~(uTruth1[0] & uTruth2[0]);
            pTemp->M[1].uPhaseBest = ~(uTruth1[1] & uTruth2[1]);
        }
    }
    uTruth[0] = pTemp->M[0].uPhaseBest;
    uTruth[1] = pTemp->M[1].uPhaseBest;
}